

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int jx9Builtin_substr_count(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  int iVar1;
  sxi32 sVar2;
  int nLen;
  int nOfft_1;
  sxi32 rc;
  sxu32 nOfft;
  int iCount;
  int nPatlen;
  int nTextlen;
  char *zEnd;
  char *zPattern;
  char *zText;
  jx9_value **apArg_local;
  jx9_context *pjStack_18;
  int nArg_local;
  jx9_context *pCtx_local;
  
  rc = 0;
  zText = (char *)apArg;
  apArg_local._4_4_ = nArg;
  pjStack_18 = pCtx;
  if (nArg < 2) {
    jx9_result_int(pCtx,0);
  }
  else {
    zPattern = jx9_value_to_string(*apArg,&iCount);
    zEnd = jx9_value_to_string(*(jx9_value **)(zText + 8),(int *)&nOfft);
    if (((iCount < 1) || ((int)nOfft < 1)) || (iCount < (int)nOfft)) {
      jx9_result_int(pjStack_18,0);
    }
    else {
      if (2 < apArg_local._4_4_) {
        iVar1 = jx9_value_to_int(*(jx9_value **)(zText + 0x10));
        if ((iVar1 < 0) || (iCount < iVar1)) {
          jx9_result_int(pjStack_18,0);
          return 0;
        }
        zPattern = zPattern + iVar1;
        iCount = iCount - iVar1;
      }
      _nPatlen = zPattern + iCount;
      if (3 < apArg_local._4_4_) {
        iVar1 = jx9_value_to_int(*(jx9_value **)(zText + 0x18));
        if ((iVar1 < 0) || (iCount < iVar1)) {
          jx9_result_int(pjStack_18,0);
          return 0;
        }
        _nPatlen = zPattern + iVar1;
        iCount = iVar1;
      }
      do {
        sVar2 = SyBlobSearch(zPattern,(int)_nPatlen - (int)zPattern,zEnd,nOfft,(sxu32 *)&nOfft_1);
        if (sVar2 != 0) break;
        rc = rc + 1;
        zPattern = zPattern + (nOfft_1 + nOfft);
      } while (zPattern < _nPatlen);
      jx9_result_int(pjStack_18,rc);
    }
  }
  return 0;
}

Assistant:

static int jx9Builtin_substr_count(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const char *zText, *zPattern, *zEnd;
	int nTextlen, nPatlen;
	int iCount = 0;
	sxu32 nOfft;
	sxi32 rc;
	if( nArg < 2 ){
		/* Missing arguments */
		jx9_result_int(pCtx, 0);
		return JX9_OK;
	}
	/* Point to the haystack */
	zText = jx9_value_to_string(apArg[0], &nTextlen);
	/* Point to the neddle */
	zPattern = jx9_value_to_string(apArg[1], &nPatlen);
	if( nTextlen < 1 || nPatlen < 1 || nPatlen > nTextlen ){
		/* NOOP, return zero */
		jx9_result_int(pCtx, 0);
		return JX9_OK;
	}
	if( nArg > 2 ){
		int nOfft;
		/* Extract the offset */
		nOfft = jx9_value_to_int(apArg[2]);
		if( nOfft < 0 || nOfft > nTextlen ){
			/* Invalid offset, return zero */
			jx9_result_int(pCtx, 0);
			return JX9_OK;
		}
		/* Point to the desired offset */
		zText = &zText[nOfft];
		/* Adjust length */
		nTextlen -= nOfft;
	}
	/* Point to the end of the string */
	zEnd = &zText[nTextlen];
	if( nArg > 3 ){
		int nLen;
		/* Extract the length */
		nLen = jx9_value_to_int(apArg[3]);
		if( nLen < 0 || nLen > nTextlen ){
			/* Invalid length, return 0 */
			jx9_result_int(pCtx, 0);
			return JX9_OK;
		}
		/* Adjust pointer */
		nTextlen = nLen;
		zEnd = &zText[nTextlen];
	}
	/* Perform the search */
	for(;;){
		rc = SyBlobSearch((const void *)zText, (sxu32)(zEnd-zText), (const void *)zPattern, nPatlen, &nOfft);
		if( rc != SXRET_OK ){
			/* Pattern not found, break immediately */
			break;
		}
		/* Increment counter and update the offset */
		iCount++;
		zText += nOfft + nPatlen;
		if( zText >= zEnd ){
			break;
		}
	}
	/* Pattern count */
	jx9_result_int(pCtx, iCount);
	return JX9_OK;
}